

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *p)

{
  anon_unknown_0 *this_00;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  initializer_list<google::protobuf::io::Printer::Sub> v_01;
  initializer_list<google::protobuf::io::Printer::Sub> v_02;
  initializer_list<google::protobuf::io::Printer::Sub> v_03;
  initializer_list<google::protobuf::io::Printer::Sub> v_04;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  FieldGenerator *this_01;
  pointer pPVar4;
  FileDescriptor *file;
  Options *in_RCX;
  undefined1 split;
  char *pcVar5;
  Iterator IVar6;
  Sub *local_14a0;
  Sub *local_1408;
  Sub *local_12e8;
  Sub *local_1278;
  Sub *local_1220;
  basic_string_view<char,_std::char_traits<char>_> local_11b0;
  undefined1 local_1199;
  anon_class_16_2_fd512ddd_for_cb local_1198;
  allocator<char> local_1181;
  string local_1180;
  anon_class_1_0_00000001_for_cb local_115a;
  allocator<char> local_1159;
  string local_1158;
  anon_class_16_2_fd512ddd_for_cb local_1138;
  allocator<char> local_1121;
  string local_1120;
  anon_class_16_2_fd512ddd_for_cb local_1100;
  allocator<char> local_10e9;
  string local_10e8;
  anon_class_16_2_fd512ddd_for_cb local_10c8;
  allocator<char> local_10b1;
  string local_10b0;
  Sub *local_1090;
  Sub local_1088;
  Sub local_fd0;
  Sub local_f18;
  Sub local_e60;
  Sub local_da8;
  iterator local_cf0;
  size_type local_ce8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_ce0;
  basic_string_view<char,_std::char_traits<char>_> local_cc8;
  basic_string_view<char,_std::char_traits<char>_> local_cb0;
  undefined1 local_c99;
  string local_c98;
  allocator<char> local_c71;
  string local_c70;
  string local_c50;
  allocator<char> local_c29;
  string local_c28;
  Sub *local_c08;
  Sub local_c00;
  Sub local_b48;
  iterator local_a90;
  size_type local_a88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a80;
  basic_string_view<char,_std::char_traits<char>_> local_a68;
  basic_string_view<char,_std::char_traits<char>_> local_a50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a38;
  undefined1 local_a20 [48];
  basic_string_view<char,_std::char_traits<char>_> local_9f0;
  basic_string_view<char,_std::char_traits<char>_> local_9d8;
  basic_string_view<char,_std::char_traits<char>_> local_9c0;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_9b0;
  Span<const_google::protobuf::io::Printer::Sub> local_998;
  undefined1 local_988 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  t_1;
  Span<const_google::protobuf::io::Printer::Sub> local_958;
  undefined1 local_948 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v_1;
  value_type_conflict field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  basic_string_view<char,_std::char_traits<char>_> local_8f0;
  basic_string_view<char,_std::char_traits<char>_> local_8d8;
  undefined1 local_8c1;
  anon_class_16_2_fd512ddd_for_cb local_8c0;
  allocator<char> local_8a9;
  string local_8a8;
  anon_class_16_2_fd512ddd_for_cb local_888;
  allocator<char> local_871;
  string local_870;
  anon_class_16_2_fd512ddd_for_cb local_850;
  allocator<char> local_839;
  string local_838;
  Sub *local_818;
  Sub local_810;
  Sub local_758;
  Sub local_6a0;
  iterator local_5e8;
  size_type local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_5d8;
  basic_string_view<char,_std::char_traits<char>_> local_5c0;
  undefined1 local_5a9;
  anon_class_16_2_fd512ddd_for_cb local_5a8;
  allocator<char> local_591;
  string local_590;
  undefined8 local_570;
  Sub local_568;
  iterator local_4b0;
  size_type local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_4a0;
  undefined1 local_490 [32];
  anon_class_16_2_fd512ddd_for_cb local_470;
  allocator<char> local_459;
  string local_458;
  anon_class_16_2_fd512ddd_for_cb local_438;
  allocator<char> local_421;
  string local_420;
  anon_class_16_2_fd512ddd_for_cb local_400;
  allocator<char> local_3e9;
  string local_3e8;
  Sub *local_3c8;
  Sub local_3c0;
  Sub local_308;
  Sub local_250;
  iterator local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_188;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_178;
  Span<const_google::protobuf::io::Printer::Sub> local_160;
  undefined1 local_150 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Options local_128;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_58;
  Span<const_google::protobuf::io::Printer::Sub> local_40;
  undefined1 local_30 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Printer *p_local;
  MessageGenerator *this_local;
  
  v.storage_.callback_buffer_._8_8_ = p;
  bVar2 = ShouldGenerateClass(this->descriptor_,&this->options_);
  uVar1 = v.storage_.callback_buffer_._8_8_;
  if (bVar2) {
    this_00 = (anon_unknown_0 *)this->descriptor_;
    cpp::Options::Options(&local_128,&this->options_);
    anon_unknown_0::ClassVars(&local_58,this_00,(Descriptor *)&local_128,in_RCX);
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
              ((Span<google::protobuf::io::Printer::Sub_const> *)&local_40,&local_58);
    io::Printer::WithVars
              ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                *)local_30,(Printer *)uVar1,local_40);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector(&local_58);
    cpp::Options::~Options(&local_128);
    uVar1 = v.storage_.callback_buffer_._8_8_;
    MakeTrackerCalls(&local_178,this->descriptor_,&this->options_);
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
              ((Span<google::protobuf::io::Printer::Sub_const> *)&local_160,&local_178);
    io::Printer::WithVars
              ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                *)local_150,(Printer *)uVar1,local_160);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector(&local_178);
    bVar2 = IsMapEntryMessage(this->descriptor_);
    uVar1 = v.storage_.callback_buffer_._8_8_;
    if (bVar2) {
      local_490[0x1f] = '\x01';
      local_3c8 = &local_3c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"annotate_accessors",&local_3e9);
      local_400.p = (Printer **)(v.storage_.callback_buffer_ + 8);
      local_400.this = this;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods(google::protobuf::io::Printer*)::__0>
                (&local_3c0,&local_3e8,&local_400);
      local_3c8 = &local_308;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"verify",&local_421);
      local_438.p = (Printer **)(v.storage_.callback_buffer_ + 8);
      local_438.this = this;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods(google::protobuf::io::Printer*)::__1>
                (&local_308,&local_420,&local_438);
      local_3c8 = &local_250;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,"class_data",&local_459);
      local_470.p = (Printer **)(v.storage_.callback_buffer_ + 8);
      local_470.this = this;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods(google::protobuf::io::Printer*)::__2>
                (&local_250,&local_458,&local_470);
      local_490[0x1f] = '\0';
      local_198 = &local_3c0;
      local_190 = 3;
      v_04._M_len = 3;
      v_04._M_array = local_198;
      absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_188._M_local_buf,v_04);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)(local_490 + 8),
                 "\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n              $classname$::$classname$() : SuperType(_class_data_.base()) {}\n              $classname$::$classname$(::$proto_ns$::Arena* arena)\n                  : SuperType(arena, _class_data_.base()) {}\n#else   // PROTOBUF_CUSTOM_VTABLE\n              $classname$::$classname$() : SuperType() {}\n              $classname$::$classname$(::$proto_ns$::Arena* arena) : SuperType(arena) {}\n#endif  // PROTOBUF_CUSTOM_VTABLE\n              $annotate_accessors$;\n              $verify$;\n              $class_data$;\n            "
                );
      io::Printer::SourceLocation::current();
      google::protobuf::io::Printer::Emit
                (uVar1,local_188._M_allocated_capacity,local_188._8_8_,local_490._8_8_,
                 local_490._16_8_);
      local_1220 = (Sub *)&local_198;
      do {
        local_1220 = local_1220 + -1;
        io::Printer::Sub::~Sub(local_1220);
      } while (local_1220 != &local_3c0);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator(&local_459);
      std::__cxx11::string::~string((string *)&local_420);
      std::allocator<char>::~allocator(&local_421);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator(&local_3e9);
      pPVar4 = std::
               unique_ptr<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
               ::operator->(&this->parse_function_generator_);
      ParseFunctionGenerator::GenerateDataDefinitions
                (pPVar4,(Printer *)v.storage_.callback_buffer_._8_8_);
      local_490._0_4_ = 1;
    }
    else {
      bVar2 = IsAnyMessage(this->descriptor_);
      uVar1 = v.storage_.callback_buffer_._8_8_;
      if (bVar2) {
        local_5a9 = '\x01';
        local_570 = &local_568;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_590,"any_field_descriptor",&local_591);
        local_5a8.p = (Printer **)(v.storage_.callback_buffer_ + 8);
        local_5a8.this = this;
        io::Printer::Sub::
        Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods(google::protobuf::io::Printer*)::__3>
                  (&local_568,&local_590,&local_5a8);
        local_5a9 = '\0';
        local_4b0 = &local_568;
        local_4a8 = 1;
        v_03._M_len = 1;
        v_03._M_array = local_4b0;
        absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
        Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                  ((Span<google::protobuf::io::Printer::Sub_const> *)local_4a0._M_local_buf,v_03);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_5c0,
                   "\n              $any_field_descriptor$;\n              bool $classname$::ParseAnyTypeUrl(::absl::string_view type_url,\n                                                std::string* full_type_name) {\n                return ::_pbi::ParseAnyTypeUrl(type_url, full_type_name);\n              }\n            "
                  );
        io::Printer::SourceLocation::current();
        google::protobuf::io::Printer::Emit
                  (uVar1,local_4a0._M_allocated_capacity,local_4a0._8_8_,local_5c0._M_len,
                   local_5c0._M_str);
        local_1278 = (Sub *)&local_4b0;
        do {
          local_1278 = local_1278 + -1;
          io::Printer::Sub::~Sub(local_1278);
        } while (local_1278 != &local_568);
        std::__cxx11::string::~string((string *)&local_590);
        std::allocator<char>::~allocator(&local_591);
      }
      uVar1 = v.storage_.callback_buffer_._8_8_;
      local_8c1 = 1;
      local_818 = &local_810;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"has_bit",&local_839);
      local_850.p = (Printer **)(v.storage_.callback_buffer_ + 8);
      local_850.this = this;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods(google::protobuf::io::Printer*)::__4>
                (&local_810,&local_838,&local_850);
      local_818 = &local_758;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_870,"oneof",&local_871);
      local_888.p = (Printer **)(v.storage_.callback_buffer_ + 8);
      local_888.this = this;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods(google::protobuf::io::Printer*)::__5>
                (&local_758,&local_870,&local_888);
      local_818 = &local_6a0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a8,"required",&local_8a9)
      ;
      local_8c0.p = (Printer **)(v.storage_.callback_buffer_ + 8);
      local_8c0.this = this;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods(google::protobuf::io::Printer*)::__6>
                (&local_6a0,&local_8a8,&local_8c0);
      local_8c1 = 0;
      local_5e8 = &local_810;
      local_5e0 = 3;
      v_02._M_len = 3;
      v_02._M_array = local_5e8;
      absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_5d8._M_local_buf,v_02);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_8d8,
                 "\n        class $classname$::_Internal {\n         public:\n          $has_bit$;\n          $oneof$;\n          $required$;\n        };\n      "
                );
      io::Printer::SourceLocation::current();
      google::protobuf::io::Printer::Emit
                (uVar1,local_5d8._M_allocated_capacity,local_5d8._8_8_,local_8d8._M_len);
      local_12e8 = (Sub *)&local_5e8;
      pcVar5 = local_8d8._M_str;
      do {
        local_12e8 = local_12e8 + -1;
        io::Printer::Sub::~Sub(local_12e8);
      } while (local_12e8 != &local_810);
      std::__cxx11::string::~string((string *)&local_8a8);
      std::allocator<char>::~allocator(&local_8a9);
      std::__cxx11::string::~string((string *)&local_870);
      std::allocator<char>::~allocator(&local_871);
      std::__cxx11::string::~string((string *)&local_838);
      std::allocator<char>::~allocator(&local_839);
      uVar1 = v.storage_.callback_buffer_._8_8_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_8f0,"\n");
      io::Printer::SourceLocation::current();
      io::Printer::Emit((Printer *)uVar1,local_8f0._M_len,local_8f0._M_str);
      __begin3.descriptor =
           (Descriptor *)
           protobuf::internal::FieldRange<google::protobuf::Descriptor>(this->descriptor_);
      IVar6 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::begin
                        ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
      __begin3._0_8_ = IVar6.descriptor;
      __end3.descriptor._0_4_ = IVar6.idx;
      IVar6 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::end
                        ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
      __end3._0_8_ = IVar6.descriptor;
      field._0_4_ = IVar6.idx;
      while( true ) {
        bVar2 = protobuf::internal::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&field);
        split = SUB81(pcVar5,0);
        if (!bVar2) break;
        v_1.storage_.callback_buffer_._8_8_ =
             protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                       ((Iterator *)&__end3.descriptor);
        uVar1 = v.storage_.callback_buffer_._8_8_;
        FieldVars((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   *)(t_1.storage_.callback_buffer_ + 8),
                  (FieldDescriptor *)v_1.storage_.callback_buffer_._8_8_,&this->options_);
        absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
        Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
                  ((Span<google::protobuf::io::Printer::Sub_const> *)&local_958,
                   (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)(t_1.storage_.callback_buffer_ + 8));
        io::Printer::WithVars
                  ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                    *)local_948,(Printer *)uVar1,local_958);
        std::
        vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
        ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   *)(t_1.storage_.callback_buffer_ + 8));
        uVar1 = v.storage_.callback_buffer_._8_8_;
        MakeTrackerCalls(&local_9b0,(FieldDescriptor *)v_1.storage_.callback_buffer_._8_8_,
                         &this->options_);
        absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
        Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
                  ((Span<google::protobuf::io::Printer::Sub_const> *)&local_998,&local_9b0);
        io::Printer::WithVars
                  ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                    *)local_988,(Printer *)uVar1,local_998);
        std::
        vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
        ::~vector(&local_9b0);
        this_01 = FieldGeneratorTable::get
                            (&this->field_generators_,
                             (FieldDescriptor *)v_1.storage_.callback_buffer_._8_8_);
        FieldGenerator::GenerateNonInlineAccessorDefinitions
                  (this_01,(Printer *)v.storage_.callback_buffer_._8_8_);
        bVar2 = anon_unknown_0::IsCrossFileMaybeMap
                          ((FieldDescriptor *)v_1.storage_.callback_buffer_._8_8_);
        if (bVar2) {
          GenerateFieldClear(this,(FieldDescriptor *)v_1.storage_.callback_buffer_._8_8_,false,
                             (Printer *)v.storage_.callback_buffer_._8_8_);
        }
        absl::lts_20240722::
        Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                    *)local_988);
        absl::lts_20240722::
        Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                    *)local_948);
        protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
                  ((Iterator *)&__end3.descriptor);
      }
      GenerateStructors(this,(Printer *)v.storage_.callback_buffer_._8_8_);
      uVar1 = v.storage_.callback_buffer_._8_8_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_9c0,"\n");
      io::Printer::SourceLocation::current();
      io::Printer::Emit((Printer *)uVar1,local_9c0._M_len,local_9c0._M_str);
      iVar3 = Descriptor::real_oneof_decl_count(this->descriptor_);
      if (0 < iVar3) {
        GenerateOneofClear(this,(Printer *)v.storage_.callback_buffer_._8_8_);
        uVar1 = v.storage_.callback_buffer_._8_8_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_9d8,"\n");
        io::Printer::SourceLocation::current();
        io::Printer::Emit((Printer *)uVar1,local_9d8._M_len,local_9d8._M_str);
      }
      GenerateClassData(this,(Printer *)v.storage_.callback_buffer_._8_8_);
      pPVar4 = std::
               unique_ptr<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
               ::operator->(&this->parse_function_generator_);
      ParseFunctionGenerator::GenerateDataDefinitions
                (pPVar4,(Printer *)v.storage_.callback_buffer_._8_8_);
      file = Descriptor::file(this->descriptor_);
      bVar2 = HasGeneratedMethods(file,&this->options_);
      if (bVar2) {
        GenerateClear(this,(Printer *)v.storage_.callback_buffer_._8_8_);
        uVar1 = v.storage_.callback_buffer_._8_8_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_9f0,"\n");
        io::Printer::SourceLocation::current();
        io::Printer::Emit((Printer *)uVar1,local_9f0._M_len,local_9f0._M_str);
        GenerateSerializeWithCachedSizesToArray(this,(Printer *)v.storage_.callback_buffer_._8_8_);
        uVar1 = v.storage_.callback_buffer_._8_8_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)(local_a20 + 0x18),"\n");
        io::Printer::SourceLocation::current();
        io::Printer::Emit((Printer *)uVar1,local_a20._24_8_,local_a20._32_8_);
        GenerateByteSize(this,(Printer *)v.storage_.callback_buffer_._8_8_);
        uVar1 = v.storage_.callback_buffer_._8_8_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_a20,"\n");
        io::Printer::SourceLocation::current();
        io::Printer::Emit((Printer *)uVar1,local_a20._0_8_,local_a20._8_8_);
        GenerateClassSpecificMergeImpl(this,(Printer *)v.storage_.callback_buffer_._8_8_);
        uVar1 = v.storage_.callback_buffer_._8_8_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_a38,"\n");
        io::Printer::SourceLocation::current();
        io::Printer::Emit((Printer *)uVar1,local_a38._M_allocated_capacity,local_a38._8_8_);
        GenerateCopyFrom(this,(Printer *)v.storage_.callback_buffer_._8_8_);
        uVar1 = v.storage_.callback_buffer_._8_8_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a50,"\n");
        io::Printer::SourceLocation::current();
        io::Printer::Emit((Printer *)uVar1,local_a50._M_len,local_a50._M_str);
        GenerateIsInitialized(this,(Printer *)v.storage_.callback_buffer_._8_8_);
        uVar1 = v.storage_.callback_buffer_._8_8_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a68,"\n");
        io::Printer::SourceLocation::current();
        io::Printer::Emit((Printer *)uVar1,local_a68._M_len,local_a68._M_str);
      }
      bVar2 = ShouldSplit(this->descriptor_,&this->options_);
      uVar1 = v.storage_.callback_buffer_._8_8_;
      if (bVar2) {
        local_c99 = 1;
        local_c08 = &local_c00;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c28,"split_default",&local_c29);
        DefaultInstanceName_abi_cxx11_
                  (&local_c50,(cpp *)this->descriptor_,(Descriptor *)&this->options_,(Options *)0x1,
                   (bool)split);
        io::Printer::Sub::Sub<std::__cxx11::string>(&local_c00,&local_c28,&local_c50);
        local_c08 = &local_b48;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c70,"default",&local_c71);
        DefaultInstanceName_abi_cxx11_
                  (&local_c98,(cpp *)this->descriptor_,(Descriptor *)&this->options_,(Options *)0x0,
                   (bool)split);
        io::Printer::Sub::Sub<std::__cxx11::string>(&local_b48,&local_c70,&local_c98);
        local_c99 = 0;
        local_a90 = &local_c00;
        local_a88 = 2;
        v_01._M_len = 2;
        v_01._M_array = local_a90;
        absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
        Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                  ((Span<google::protobuf::io::Printer::Sub_const> *)local_a80._M_local_buf,v_01);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_cb0,
                   "\n              void $classname$::PrepareSplitMessageForWrite() {\n                if (PROTOBUF_PREDICT_TRUE(IsSplitMessageDefault())) {\n                  void* chunk = $pbi$::CreateSplitMessageGeneric(\n                      GetArena(), &$split_default$, sizeof(Impl_::Split), this,\n                      &$default$);\n                  $split$ = reinterpret_cast<Impl_::Split*>(chunk);\n                }\n              }\n            "
                  );
        io::Printer::SourceLocation::current();
        google::protobuf::io::Printer::Emit
                  (uVar1,local_a80._M_allocated_capacity,local_a80._8_8_,local_cb0._M_len,
                   local_cb0._M_str);
        local_1408 = (Sub *)&local_a90;
        do {
          local_1408 = local_1408 + -1;
          io::Printer::Sub::~Sub(local_1408);
        } while (local_1408 != &local_c00);
        std::__cxx11::string::~string((string *)&local_c98);
        std::__cxx11::string::~string((string *)&local_c70);
        std::allocator<char>::~allocator(&local_c71);
        std::__cxx11::string::~string((string *)&local_c50);
        std::__cxx11::string::~string((string *)&local_c28);
        std::allocator<char>::~allocator(&local_c29);
      }
      GenerateVerify(this,(Printer *)v.storage_.callback_buffer_._8_8_);
      GenerateSwap(this,(Printer *)v.storage_.callback_buffer_._8_8_);
      uVar1 = v.storage_.callback_buffer_._8_8_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_cc8,"\n");
      io::Printer::SourceLocation::current();
      io::Printer::Emit((Printer *)uVar1,local_cc8._M_len,local_cc8._M_str);
      uVar1 = v.storage_.callback_buffer_._8_8_;
      local_1199 = 1;
      local_1090 = &local_1088;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10b0,"annotate_accessor_definition",&local_10b1);
      local_10c8.p = (Printer **)(v.storage_.callback_buffer_ + 8);
      local_10c8.this = this;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods(google::protobuf::io::Printer*)::__7>
                (&local_1088,&local_10b0,&local_10c8);
      local_1090 = &local_fd0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10e8,"get_metadata",&local_10e9);
      local_1100.p = (Printer **)(v.storage_.callback_buffer_ + 8);
      local_1100.this = this;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods(google::protobuf::io::Printer*)::__8>
                (&local_fd0,&local_10e8,&local_1100);
      local_1090 = &local_f18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1120,"post_loop_handler",&local_1121);
      local_1138.p = (Printer **)(v.storage_.callback_buffer_ + 8);
      local_1138.this = this;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods(google::protobuf::io::Printer*)::__9>
                (&local_f18,&local_1120,&local_1138);
      local_1090 = &local_e60;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1158,"message_set_definition",&local_1159);
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods(google::protobuf::io::Printer*)::__10>
                (&local_e60,&local_1158,&local_115a);
      local_1090 = &local_da8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1180,"tracker_decl",&local_1181);
      local_1198.p = (Printer **)(v.storage_.callback_buffer_ + 8);
      local_1198.this = this;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods(google::protobuf::io::Printer*)::__11>
                (&local_da8,&local_1180,&local_1198);
      local_1199 = 0;
      local_cf0 = &local_1088;
      local_ce8 = 5;
      v_00._M_len = 5;
      v_00._M_array = local_cf0;
      absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_ce0._M_local_buf,v_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_11b0,
                 "\n        $annotate_accessor_definition$;\n        $get_metadata$;\n        $post_loop_handler$;\n        $message_set_definition$;\n        $tracker_decl$;\n      "
                );
      io::Printer::SourceLocation::current();
      google::protobuf::io::Printer::Emit
                (uVar1,local_ce0._M_allocated_capacity,local_ce0._8_8_,local_11b0._M_len,
                 local_11b0._M_str);
      local_14a0 = (Sub *)&local_cf0;
      do {
        local_14a0 = local_14a0 + -1;
        io::Printer::Sub::~Sub(local_14a0);
      } while (local_14a0 != &local_1088);
      std::__cxx11::string::~string((string *)&local_1180);
      std::allocator<char>::~allocator(&local_1181);
      std::__cxx11::string::~string((string *)&local_1158);
      std::allocator<char>::~allocator(&local_1159);
      std::__cxx11::string::~string((string *)&local_1120);
      std::allocator<char>::~allocator(&local_1121);
      std::__cxx11::string::~string((string *)&local_10e8);
      std::allocator<char>::~allocator(&local_10e9);
      std::__cxx11::string::~string((string *)&local_10b0);
      std::allocator<char>::~allocator(&local_10b1);
      local_490._0_4_ = 0;
    }
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                *)local_150);
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                *)local_30);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClassMethods(io::Printer* p) {
  if (!ShouldGenerateClass(descriptor_, options_)) return;

  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));

  if (IsMapEntryMessage(descriptor_)) {
    p->Emit({{"annotate_accessors",
              [&] {
                if (!options_.annotate_accessor) return;
                for (auto f : FieldRange(descriptor_)) {
                  p->Emit({{"field", FieldName(f)}},
                          R"cc(
                            volatile bool $classname$::$field$_AccessedNoStrip;
                          )cc");
                }
              }},
             {"verify",
              [&] {
                // Delegates generating verify function as only a subset of map
                // entry messages need it; i.e. UTF8 string key/value or message
                // type value.
                GenerateVerify(p);
              }},
             {"class_data", [&] { GenerateClassData(p); }}},
            R"cc(
#if defined(PROTOBUF_CUSTOM_VTABLE)
              $classname$::$classname$() : SuperType(_class_data_.base()) {}
              $classname$::$classname$(::$proto_ns$::Arena* arena)
                  : SuperType(arena, _class_data_.base()) {}
#else   // PROTOBUF_CUSTOM_VTABLE
              $classname$::$classname$() : SuperType() {}
              $classname$::$classname$(::$proto_ns$::Arena* arena) : SuperType(arena) {}
#endif  // PROTOBUF_CUSTOM_VTABLE
              $annotate_accessors$;
              $verify$;
              $class_data$;
            )cc");
    parse_function_generator_->GenerateDataDefinitions(p);
    return;
  }
  if (IsAnyMessage(descriptor_)) {
    p->Emit({{"any_field_descriptor",
              [&] {
                if (!HasDescriptorMethods(descriptor_->file(), options_)) {
                  return;
                }
                p->Emit(
                    R"cc(
                      bool $classname$::GetAnyFieldDescriptors(
                          const ::$proto_ns$::Message& message,
                          const ::$proto_ns$::FieldDescriptor** type_url_field,
                          const ::$proto_ns$::FieldDescriptor** value_field) {
                        return ::_pbi::GetAnyFieldDescriptors(message, type_url_field, value_field);
                      }
                    )cc");
              }}},
            R"cc(
              $any_field_descriptor$;
              bool $classname$::ParseAnyTypeUrl(::absl::string_view type_url,
                                                std::string* full_type_name) {
                return ::_pbi::ParseAnyTypeUrl(type_url, full_type_name);
              }
            )cc");
  }
  p->Emit(
      {{"has_bit",
        [&] {
          if (has_bit_indices_.empty()) return;
          p->Emit(
              R"cc(
                using HasBits =
                    decltype(std::declval<$classname$>().$has_bits$);
                static constexpr ::int32_t kHasBitsOffset =
                    8 * PROTOBUF_FIELD_OFFSET($classname$, _impl_._has_bits_);
              )cc");
        }},
       {"oneof",
        [&] {
          if (descriptor_->real_oneof_decl_count() == 0) return;
          p->Emit(
              R"cc(
                static constexpr ::int32_t kOneofCaseOffset =
                    PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$);
              )cc");
        }},
       {"required",
        [&] {
          if (num_required_fields_ == 0) return;
          const std::vector<uint32_t> masks_for_has_bits =
              RequiredFieldsBitMask();
          p->Emit(
              {{"check_bit_mask", ConditionalToCheckBitmasks(
                                      masks_for_has_bits, false, "has_bits")}},
              R"cc(
                static bool MissingRequiredFields(const HasBits& has_bits) {
                  return $check_bit_mask$;
                }
              )cc");
        }}},
      R"cc(
        class $classname$::_Internal {
         public:
          $has_bit$;
          $oneof$;
          $required$;
        };
      )cc");
  p->Emit("\n");

  // Generate non-inline field definitions.
  for (auto field : FieldRange(descriptor_)) {
    auto v = p->WithVars(FieldVars(field, options_));
    auto t = p->WithVars(MakeTrackerCalls(field, options_));
    field_generators_.get(field).GenerateNonInlineAccessorDefinitions(p);
    if (IsCrossFileMaybeMap(field)) {
      GenerateFieldClear(field, false, p);
    }
  }

  GenerateStructors(p);
  p->Emit("\n");

  if (descriptor_->real_oneof_decl_count() > 0) {
    GenerateOneofClear(p);
    p->Emit("\n");
  }

  GenerateClassData(p);
  parse_function_generator_->GenerateDataDefinitions(p);

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    GenerateClear(p);
    p->Emit("\n");

    GenerateSerializeWithCachedSizesToArray(p);
    p->Emit("\n");

    GenerateByteSize(p);
    p->Emit("\n");

    GenerateClassSpecificMergeImpl(p);
    p->Emit("\n");

    GenerateCopyFrom(p);
    p->Emit("\n");

    GenerateIsInitialized(p);
    p->Emit("\n");
  }

  if (ShouldSplit(descriptor_, options_)) {
    p->Emit({{"split_default",
              DefaultInstanceName(descriptor_, options_, /*split=*/true)},
             {"default",
              DefaultInstanceName(descriptor_, options_, /*split=*/false)}},
            R"cc(
              void $classname$::PrepareSplitMessageForWrite() {
                if (PROTOBUF_PREDICT_TRUE(IsSplitMessageDefault())) {
                  void* chunk = $pbi$::CreateSplitMessageGeneric(
                      GetArena(), &$split_default$, sizeof(Impl_::Split), this,
                      &$default$);
                  $split$ = reinterpret_cast<Impl_::Split*>(chunk);
                }
              }
            )cc");
  }

  GenerateVerify(p);

  GenerateSwap(p);
  p->Emit("\n");

  p->Emit(
      {{"annotate_accessor_definition",
        [&] {
          if (!options_.annotate_accessor) return;
          for (auto f : FieldRange(descriptor_)) {
            p->Emit({{"field", FieldName(f)}},
                    R"cc(
                      volatile bool $classname$::$field$_AccessedNoStrip;
                    )cc");
          }
        }},
       {"get_metadata",
        [&] {
          if (!HasDescriptorMethods(descriptor_->file(), options_)) return;
          // Same as the base class, but it avoids virtual dispatch.
          p->Emit(R"cc(
            ::$proto_ns$::Metadata $classname$::GetMetadata() const {
              return $superclass$::GetMetadataImpl(GetClassData()->full());
            }
          )cc");
        }},
       {"post_loop_handler",
        [&] {
          if (!NeedsPostLoopHandler(descriptor_, options_)) return;
          p->Emit({{"required",
                    [&] {
                    }}},
                  R"cc(
                    const char* $classname$::PostLoopHandler(
                        MessageLite* msg, const char* ptr,
                        ::_pbi::ParseContext* ctx) {
                      $classname$* _this = static_cast<$classname$*>(msg);
                      $annotate_deserialize$;
                      $required$;
                      return ptr;
                    }
                  )cc");
        }},
       {"message_set_definition",
        [&] {
        }},
       {"tracker_decl",
        [&] {
          if (!HasTracker(descriptor_, options_)) return;
          p->Emit(R"cc(
            ::$proto_ns$::AccessListener<$classtype$> $classname$::$tracker$(
                &FullMessageName);
          )cc");
        }}},
      R"cc(
        $annotate_accessor_definition$;
        $get_metadata$;
        $post_loop_handler$;
        $message_set_definition$;
        $tracker_decl$;
      )cc");
}